

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCall
          (Server *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  undefined6 in_register_00000012;
  DispatchCallResult DVar2;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar1;
  
  if (CONCAT62(in_register_00000012,methodId) == -0x5f188fca4200ffaf) {
    DVar2 = TestCallOrder::Server::dispatchCallInternal
                      ((Server *)this,
                       (uint16_t)interfaceId + (short)*(undefined8 *)(*(long *)interfaceId + -0x30),
                       (CallContextHook *)((ulong)context.hook & 0xffff));
    uVar1 = DVar2._8_8_;
  }
  else if (CONCAT62(in_register_00000012,methodId) == -0x2238f40687becc31) {
    DVar2 = dispatchCallInternal
                      (this,(uint16_t)interfaceId,(CallContextHook *)((ulong)context.hook & 0xffff))
    ;
    uVar1 = DVar2._8_8_;
  }
  else {
    DVar2 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,
                       (char *)(interfaceId + *(long *)(*(long *)interfaceId + -0x18)),0x491d21);
    uVar1 = DVar2._8_8_;
  }
  DVar2.isStreaming = (bool)(char)uVar1;
  DVar2.allowCancellation = (bool)(char)((ulong)uVar1 >> 8);
  DVar2._10_6_ = (int6)((ulong)uVar1 >> 0x10);
  DVar2.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar2;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMoreStuff::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (interfaceId) {
    case 0xddc70bf9784133cfull:
      return dispatchCallInternal(methodId, context);
    case 0xa0e77035bdff0051ull:
      return  ::capnproto_test::capnp::test::TestCallOrder::Server::dispatchCallInternal(methodId, context);
    default:
      return internalUnimplemented("capnp/test.capnp:TestMoreStuff", interfaceId);
  }
}